

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O0

void YUY2ToARGBRow_C(uint8_t *src_yuy2,uint8_t *rgb_buf,YuvConstants *yuvconstants,int width)

{
  uint in_ECX;
  long in_RSI;
  uint8_t *in_RDI;
  uint8_t *unaff_retaddr;
  int x;
  int local_20;
  long local_10;
  
  local_10 = in_RSI;
  for (local_20 = 0; local_20 < (int)(in_ECX - 1); local_20 = local_20 + 2) {
    libyuv::YuvPixel(yuvconstants._7_1_,yuvconstants._6_1_,yuvconstants._5_1_,
                     (uint8_t *)CONCAT44(width,x),unaff_retaddr,in_RDI,(YuvConstants *)src_yuy2);
    *(undefined1 *)(local_10 + 3) = 0xff;
    libyuv::YuvPixel(yuvconstants._7_1_,yuvconstants._6_1_,yuvconstants._5_1_,
                     (uint8_t *)CONCAT44(width,x),unaff_retaddr,in_RDI,(YuvConstants *)src_yuy2);
    *(undefined1 *)(local_10 + 7) = 0xff;
    in_RDI = in_RDI + 4;
    local_10 = local_10 + 8;
  }
  if ((in_ECX & 1) != 0) {
    libyuv::YuvPixel(yuvconstants._7_1_,yuvconstants._6_1_,yuvconstants._5_1_,
                     (uint8_t *)CONCAT44(width,x),unaff_retaddr,in_RDI,(YuvConstants *)src_yuy2);
    *(undefined1 *)(local_10 + 3) = 0xff;
  }
  return;
}

Assistant:

void YUY2ToARGBRow_C(const uint8_t* src_yuy2,
                     uint8_t* rgb_buf,
                     const struct YuvConstants* yuvconstants,
                     int width) {
  int x;
  for (x = 0; x < width - 1; x += 2) {
    YuvPixel(src_yuy2[0], src_yuy2[1], src_yuy2[3], rgb_buf + 0, rgb_buf + 1,
             rgb_buf + 2, yuvconstants);
    rgb_buf[3] = 255;
    YuvPixel(src_yuy2[2], src_yuy2[1], src_yuy2[3], rgb_buf + 4, rgb_buf + 5,
             rgb_buf + 6, yuvconstants);
    rgb_buf[7] = 255;
    src_yuy2 += 4;
    rgb_buf += 8;  // Advance 2 pixels.
  }
  if (width & 1) {
    YuvPixel(src_yuy2[0], src_yuy2[1], src_yuy2[3], rgb_buf + 0, rgb_buf + 1,
             rgb_buf + 2, yuvconstants);
    rgb_buf[3] = 255;
  }
}